

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::CartesianProductGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::ComputeCurrentValue
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  bool bVar1;
  shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> *__r;
  shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> *in_RDI;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *unaff_retaddr;
  _func_void_int_ptr_int_int_uchar_ptr **in_stack_00000008;
  
  bVar1 = AtEnd(unaff_retaddr);
  if (!bVar1) {
    std::
    get<0ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                *)0xaf6bea);
    __r = (shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> *)
          ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>::operator*
                    ((ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)> *)0xaf6bf2);
    std::
    get<1ul,testing::internal::ParamIterator<void(*)(int_const*,int,int,unsigned_char*)>,testing::internal::ParamIterator<int>>
              ((tuple<testing::internal::ParamIterator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>,_testing::internal::ParamIterator<int>_>
                *)0xaf6c04);
    ParamIterator<int>::operator*((ParamIterator<int> *)0xaf6c0c);
    std::
    make_shared<std::tuple<void(*)(int_const*,int,int,unsigned_char*),int>,void(*const&)(int_const*,int,int,unsigned_char*),int_const&>
              (in_stack_00000008,(int *)unaff_retaddr);
    std::shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>::operator=
              (in_RDI,__r);
    std::shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_>::~shared_ptr
              ((shared_ptr<std::tuple<void_(*)(const_int_*,_int,_int,_unsigned_char_*),_int>_> *)
               0xaf6c3a);
  }
  return;
}

Assistant:

void ComputeCurrentValue() {
      if (!AtEnd())
        current_value_ = std::make_shared<ParamType>(*std::get<I>(current_)...);
    }